

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
regex_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(regex_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,const_reference val,error_code *param_3)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined2 uVar4;
  bool val_00;
  undefined4 in_stack_ffffffffffffff90;
  match_flag_type in_stack_ffffffffffffff94;
  undefined4 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_40 [64];
  
  __s = in_RDI;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(in_RSI);
  if (bVar1) {
    uVar4 = (undefined2)((ulong)local_40 >> 0x30);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
              (in_stack_ffffffffffffffb8);
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (__s,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_RDI,
                       in_stack_ffffffffffffff94);
    uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
    val_00 = SUB21((ushort)uVar4 >> 8,0);
    if (bVar1) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 CONCAT44(uVar5,in_stack_ffffffffffffff90),val_00,(semantic_tag)uVar4);
    }
    else {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 CONCAT44(uVar5,in_stack_ffffffffffffff90),val_00,(semantic_tag)uVar4);
    }
    std::__cxx11::string::~string(local_40);
    uVar2 = extraout_RDX_00;
  }
  else {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    uVar2 = extraout_RDX;
  }
  bVar3.field_0.int64_.val_ = uVar2;
  bVar3.field_0._0_8_ = __s;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar3.field_0;
}

Assistant:

Json evaluate(const_reference val, std::error_code&) const override
        {
            if (!val.is_string())
            {
                return Json::null();
            }
            return std::regex_search(val.as_string(), pattern_) ? Json(true, semantic_tag::none) : Json(false, semantic_tag::none);
        }